

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KmerCounter.cc
# Opt level: O0

void __thiscall KmerCounter::write_counts(KmerCounter *this,ofstream *count_file)

{
  char *in_RSI;
  string *in_RDI;
  ofstream *unaff_retaddr;
  string *v;
  
  v = in_RDI;
  std::ostream::write(in_RSI,(long)(in_RDI + 4));
  std::ostream::write(in_RSI,(long)&in_RDI[4].field_2);
  sdglib::write_string(unaff_retaddr,v);
  sdglib::write_stringvector
            ((ofstream *)this,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)count_file);
  if ((char)in_RDI[4]._M_dataplus < ' ') {
    sdglib::write_flat_vector<unsigned_long>
              (unaff_retaddr,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)v);
  }
  else {
    sdglib::write_flat_vector<unsigned__int128>
              (unaff_retaddr,(vector<unsigned___int128,_std::allocator<unsigned___int128>_> *)v);
  }
  sdglib::write_flat_vectorvector<unsigned_short>
            ((ofstream *)this,
             (vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
              *)count_file);
  return;
}

Assistant:

void KmerCounter::write_counts(std::ofstream &count_file) const {
    count_file.write((char *) &k, sizeof(k));
    count_file.write((char *) &count_mode, sizeof(count_mode));
    sdglib::write_string(count_file,name);
    sdglib::write_stringvector(count_file,count_names);
    if (k<=31) sdglib::write_flat_vector(count_file,kindex);
    else sdglib::write_flat_vector(count_file,kindex128);
    sdglib::write_flat_vectorvector(count_file,counts);
}